

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_encoder.hpp
# Opt level: O0

bool __thiscall
jsoncons::basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::
visit_byte_string(basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_> *this
                 ,byte_string_view *b,semantic_tag tag,ser_context *param_4,error_code *param_5)

{
  ulong uVar1;
  bool bVar2;
  byte_string_chars_format bVar3;
  reference pvVar4;
  size_t sVar5;
  const_iterator puVar6;
  type_conflict2 tVar7;
  char in_DL;
  byte_string_view *in_RSI;
  long in_RDI;
  size_t length_2;
  size_t length_1;
  size_t length;
  byte_string_chars_format format;
  byte_string_chars_format encoding_hint;
  uchar *in_stack_ffffffffffffff88;
  basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>
  *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  char ch;
  undefined6 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa6;
  undefined1 in_stack_ffffffffffffffa7;
  byte_string_chars_format local_29;
  
  ch = (char)((ulong)in_stack_ffffffffffffff98 >> 0x38);
  bVar2 = std::
          vector<jsoncons::basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
          ::empty((vector<jsoncons::basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
                   *)CONCAT17(in_stack_ffffffffffffffa7,
                              CONCAT16(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0)));
  if (!bVar2) {
    pvVar4 = std::
             vector<jsoncons::basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
             ::back((vector<jsoncons::basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
                     *)in_stack_ffffffffffffff90);
    bVar2 = encoding_context::is_array(pvVar4);
    if (bVar2) {
      begin_scalar_value((basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>
                          *)CONCAT17(in_stack_ffffffffffffffa7,
                                     CONCAT16(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0)))
      ;
    }
    pvVar4 = std::
             vector<jsoncons::basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
             ::back((vector<jsoncons::basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
                     *)in_stack_ffffffffffffff90);
    bVar2 = encoding_context::is_multi_line(pvVar4);
    if ((!bVar2) &&
       (uVar1 = *(ulong *)(in_RDI + 0x1a8),
       sVar5 = basic_json_encode_options<char>::line_length_limit
                         ((basic_json_encode_options<char> *)(in_RDI + 0x40)), sVar5 <= uVar1)) {
      break_line(in_stack_ffffffffffffff90);
    }
  }
  if (in_DL == '\b') {
    local_29 = base16;
  }
  else if (in_DL == '\t') {
    local_29 = base64;
  }
  else if (in_DL == '\f') {
    local_29 = base64url;
  }
  else {
    local_29 = none;
  }
  bVar3 = basic_json_encode_options<char>::byte_string_format
                    ((basic_json_encode_options<char> *)(in_RDI + 0x40));
  bVar3 = detail::resolve_byte_string_chars_format(bVar3,local_29,base64url);
  if (bVar3 == base16) {
    stream_sink<char>::push_back
              ((stream_sink<char> *)CONCAT17(in_DL,CONCAT16(1,in_stack_ffffffffffffffa0)),ch);
    puVar6 = byte_string_view::begin(in_RSI);
    byte_string_view::end(in_RSI);
    tVar7 = encode_base16<unsigned_char_const*,jsoncons::stream_sink<char>>
                      ((uchar *)CONCAT17(in_DL,CONCAT16(bVar3,in_stack_ffffffffffffffa0)),puVar6,
                       (stream_sink<char> *)in_stack_ffffffffffffff90);
    stream_sink<char>::push_back
              ((stream_sink<char> *)CONCAT17(in_DL,CONCAT16(bVar3,in_stack_ffffffffffffffa0)),
               (char)((ulong)puVar6 >> 0x38));
    *(type_conflict2 *)(in_RDI + 0x1a8) = tVar7 + 2 + *(long *)(in_RDI + 0x1a8);
  }
  else if (bVar3 == base64) {
    stream_sink<char>::push_back
              ((stream_sink<char> *)CONCAT17(in_DL,CONCAT16(2,in_stack_ffffffffffffffa0)),ch);
    in_stack_ffffffffffffff90 =
         (basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_> *)
         byte_string_view::begin(in_RSI);
    byte_string_view::end(in_RSI);
    tVar7 = encode_base64<unsigned_char_const*,jsoncons::stream_sink<char>>
                      ((uchar *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                       (stream_sink<char> *)0x211cff);
    stream_sink<char>::push_back
              ((stream_sink<char> *)CONCAT17(in_DL,CONCAT16(bVar3,in_stack_ffffffffffffffa0)),ch);
    *(type_conflict2 *)(in_RDI + 0x1a8) = tVar7 + 2 + *(long *)(in_RDI + 0x1a8);
  }
  else {
    stream_sink<char>::push_back
              ((stream_sink<char> *)CONCAT17(in_DL,CONCAT16(bVar3,in_stack_ffffffffffffffa0)),ch);
    puVar6 = byte_string_view::begin(in_RSI);
    byte_string_view::end(in_RSI);
    tVar7 = encode_base64url<unsigned_char_const*,jsoncons::stream_sink<char>>
                      ((uchar *)in_stack_ffffffffffffff90,puVar6,(stream_sink<char> *)0x211d75);
    stream_sink<char>::push_back
              ((stream_sink<char> *)CONCAT17(in_DL,CONCAT16(bVar3,in_stack_ffffffffffffffa0)),ch);
    *(type_conflict2 *)(in_RDI + 0x1a8) = tVar7 + 2 + *(long *)(in_RDI + 0x1a8);
  }
  end_value(in_stack_ffffffffffffff90);
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_byte_string(const byte_string_view& b, 
                                  semantic_tag tag,
                                  const ser_context&,
                                  std::error_code&) final
        {
            if (!stack_.empty()) 
            {
                if (stack_.back().is_array())
                {
                    begin_scalar_value();
                }
                if (!stack_.back().is_multi_line() && column_ >= options_.line_length_limit())
                {
                    break_line();
                }
            }

            byte_string_chars_format encoding_hint;
            switch (tag)
            {
                case semantic_tag::base16:
                    encoding_hint = byte_string_chars_format::base16;
                    break;
                case semantic_tag::base64:
                    encoding_hint = byte_string_chars_format::base64;
                    break;
                case semantic_tag::base64url:
                    encoding_hint = byte_string_chars_format::base64url;
                    break;
                default:
                    encoding_hint = byte_string_chars_format::none;
                    break;
            }

            byte_string_chars_format format = jsoncons::detail::resolve_byte_string_chars_format(options_.byte_string_format(), 
                                                                                                 encoding_hint, 
                                                                                                 byte_string_chars_format::base64url);
            switch (format)
            {
                case byte_string_chars_format::base16:
                {
                    sink_.push_back('\"');
                    std::size_t length = encode_base16(b.begin(),b.end(),sink_);
                    sink_.push_back('\"');
                    column_ += (length + 2);
                    break;
                }
                case byte_string_chars_format::base64:
                {
                    sink_.push_back('\"');
                    std::size_t length = encode_base64(b.begin(), b.end(), sink_);
                    sink_.push_back('\"');
                    column_ += (length + 2);
                    break;
                }
                case byte_string_chars_format::base64url:
                {
                    sink_.push_back('\"');
                    std::size_t length = encode_base64url(b.begin(),b.end(),sink_);
                    sink_.push_back('\"');
                    column_ += (length + 2);
                    break;
                }
                default:
                {
                    JSONCONS_UNREACHABLE();
                }
            }

            end_value();
            JSONCONS_VISITOR_RETURN;
        }